

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align.h
# Opt level: O1

ArenaAlign google::protobuf::internal::ArenaAlignAs(size_t align)

{
  Nonnull<const_char_*> pcVar1;
  bool bVar2;
  string_view str;
  LogMessage local_30;
  size_t local_20;
  
  if (align == 0) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                       (0,0,"align != 0U");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    bVar2 = (align & align - 1) != 0;
    if (align == 0 || bVar2) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                 ,0x9f,"absl::has_single_bit(align)");
      str._M_str = "Invalid alignment ";
      str._M_len = 0x12;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_30,str);
      local_20 = align;
      absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>
                (&local_30,&local_20);
      if (align == 0 || bVar2) goto LAB_002edb69;
    }
    return (ArenaAlign)align;
  }
  ArenaAlignAs();
LAB_002edb69:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline ArenaAlign ArenaAlignAs(size_t align) {
  // align must be a non zero power of 2 >= 8
  ABSL_DCHECK_NE(align, 0U);
  ABSL_DCHECK(absl::has_single_bit(align)) << "Invalid alignment " << align;
  return ArenaAlign{align};
}